

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O3

os_specfile_t os_is_special_file(char *fname)

{
  int iVar1;
  
  if (*fname == '.') {
    if (fname[1] == '\0') {
      return OS_SPECFILE_SELF;
    }
    if ((fname[1] == '/') && (fname[2] == '\0')) {
      return OS_SPECFILE_SELF;
    }
    if ((fname[1] == '.') && (fname[2] == '\0')) {
      return OS_SPECFILE_PARENT;
    }
  }
  iVar1 = strcmp(fname,"../");
  return (uint)(iVar1 == 0) * 2;
}

Assistant:

os_specfile_t
os_is_special_file( const char* fname )
{
    // We also check for "./" and "../" instead of just "." and
    // "..".  (We use OSPATHCHAR instead of '/' though.)
    const char selfWithSep[3] = {'.', OSPATHCHAR, '\0'};
    const char parentWithSep[4] = {'.', '.', OSPATHCHAR, '\0'};
    if ((strcmp(fname, ".") == 0) or (strcmp(fname, selfWithSep) == 0)) return OS_SPECFILE_SELF;
    if ((strcmp(fname, "..") == 0) or (strcmp(fname, parentWithSep) == 0)) return OS_SPECFILE_PARENT;
    return OS_SPECFILE_NONE;
}